

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icupkg.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  char cVar1;
  UBool UVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  char *pcVar6;
  Package *this;
  Package *pPVar7;
  Package *pPVar8;
  FileStream *fileStream;
  Item *pIVar9;
  byte bVar10;
  bool bVar11;
  char *s;
  char local_498 [2];
  char suffix [6];
  char outFilenameBuffer [1024];
  FileStream *out;
  int32_t i;
  char *type;
  int autoPrefix;
  Package *local_68;
  Package *addListPkg;
  Package *listPkg;
  Package *pkg;
  int result;
  UBool isPackage;
  UBool isModified;
  UBool isHelp;
  char outType;
  char *outComment;
  char *outFilename;
  char *inFilename;
  char *destPath;
  char *sourcePath;
  char *pname;
  char **argv_local;
  int argc_local;
  
  pkg._0_4_ = 0;
  pcVar6 = findBasename(*argv);
  iVar3 = u_parseArgs(argc,argv,0x11,options);
  if (options[0].doesOccur == '\0' && options[1].doesOccur == '\0') {
    this = (Package *)operator_new(0x31218);
    icu_63::Package::Package(this);
    if (this == (Package *)0x0) {
      fprintf(_stderr,"icupkg: not enough memory\n");
      argv_local._4_4_ = 7;
    }
    else {
      bVar10 = options[0xe].doesOccur != '\0';
      if ((bool)bVar10) {
        icu_63::Package::setAutoPrefix(this);
      }
      if (options[0xf].doesOccur != '\0') {
        if (options[0x10].doesOccur != '\0') {
          fprintf(_stderr,"icupkg: --auto_toc_prefix_with_type and also --toc_prefix\n");
          printUsage(pcVar6,'\0');
          return 1;
        }
        icu_63::Package::setAutoPrefixWithType(this);
        bVar10 = bVar10 + 1;
      }
      if (((iVar3 < 2) || (3 < iVar3)) || (1 < bVar10)) {
        printUsage(pcVar6,'\0');
        argv_local._4_4_ = 1;
      }
      else {
        if (options[5].doesOccur == '\0') {
          destPath = (char *)0x0;
        }
        else {
          destPath = options[5].value;
        }
        if (options[6].doesOccur == '\0') {
          inFilename = (char *)0x0;
        }
        else {
          inFilename = options[6].value;
        }
        iVar4 = strcmp(argv[1],"new");
        if (iVar4 == 0) {
          if (bVar10 != 0) {
            fprintf(_stderr,"icupkg: --auto_toc_prefix[_with_type] but no input package\n");
            printUsage(pcVar6,'\0');
            return 1;
          }
          outFilename = (char *)0x0;
          pkg._4_1_ = true;
        }
        else {
          outFilename = argv[1];
          UVar2 = isPackageName(outFilename);
          if (UVar2 == '\0') {
            icu_63::Package::addFile(this,destPath,outFilename);
          }
          else {
            icu_63::Package::readPackage(this,outFilename);
          }
          pkg._4_1_ = UVar2 != '\0';
        }
        if (iVar3 < 3) {
          if (!pkg._4_1_) {
            outComment = outFilename;
          }
          else {
            outComment = (char *)0x0;
          }
          pkg._5_1_ = !pkg._4_1_ && destPath != inFilename;
        }
        else {
          outComment = argv[2];
          iVar3 = strcmp(argv[1],argv[2]);
          pkg._5_1_ = iVar3 != 0;
        }
        if (options[2].doesOccur == '\0') {
          if (pkg._4_1_) {
            pkg._7_1_ = icu_63::Package::getInType(this);
          }
          else {
            pkg._7_1_ = '\0';
          }
        }
        else {
          if ((*options[2].value == '\0') || (options[2].value[1] != '\0')) {
            printUsage(pcVar6,'\0');
            return 1;
          }
          pkg._7_1_ = *options[2].value;
          if (((pkg._7_1_ != 'b') && (pkg._7_1_ != 'e')) && (pkg._7_1_ != 'l')) {
            printUsage(pcVar6,'\0');
            return 1;
          }
          bVar11 = true;
          if (pkg._4_1_) {
            cVar1 = icu_63::Package::getInType(this);
            bVar11 = pkg._7_1_ != cVar1;
          }
          pkg._5_1_ = (bool)(pkg._5_1_ | bVar11);
        }
        if (options[7].doesOccur != '\0') {
          pkg._5_1_ = true;
        }
        if (pkg._4_1_) {
          if (options[4].doesOccur == '\0') {
            if (options[3].doesOccur == '\0') {
              _result = (char *)0x0;
            }
            else {
              _result = 
              " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
              ;
            }
          }
          else {
            _result = options[4].value;
          }
          if (options[8].doesOccur != '\0') {
            iVar3 = strcmp(options[8].value,"noslash");
            if (iVar3 != 0) {
              printUsage(pcVar6,'\0');
              return 1;
            }
            icu_63::Package::setMatchMode(this,1);
          }
          if (options[10].doesOccur != '\0') {
            pPVar7 = (Package *)operator_new(0x31218);
            icu_63::Package::Package(pPVar7);
            if (pPVar7 == (Package *)0x0) {
              fprintf(_stderr,"icupkg: not enough memory\n");
              exit(7);
            }
            pPVar8 = readList((char *)0x0,options[10].value,'\0',pPVar7);
            if (pPVar8 == (Package *)0x0) {
              printUsage(pcVar6,'\0');
              return 1;
            }
            icu_63::Package::removeItems(this,pPVar7);
            if (pPVar7 != (Package *)0x0) {
              icu_63::Package::~Package(pPVar7);
              operator_delete(pPVar7);
            }
            pkg._5_1_ = true;
          }
          local_68 = (Package *)0x0;
          if (options[9].doesOccur != '\0') {
            local_68 = (Package *)operator_new(0x31218);
            icu_63::Package::Package(local_68);
            if (local_68 == (Package *)0x0) {
              fprintf(_stderr,"icupkg: not enough memory\n");
              exit(7);
            }
            pPVar7 = readList(destPath,options[9].value,'\x01',local_68);
            if (pPVar7 == (Package *)0x0) {
              printUsage(pcVar6,'\0');
              return 1;
            }
            icu_63::Package::addItems(this,local_68);
            pkg._5_1_ = true;
          }
          if (options[0xb].doesOccur != '\0') {
            pPVar7 = (Package *)operator_new(0x31218);
            icu_63::Package::Package(pPVar7);
            if (pPVar7 == (Package *)0x0) {
              fprintf(_stderr,"icupkg: not enough memory\n");
              exit(7);
            }
            pPVar8 = readList((char *)0x0,options[0xb].value,'\0',pPVar7);
            if (pPVar8 == (Package *)0x0) {
              printUsage(pcVar6,'\0');
              return 1;
            }
            icu_63::Package::extractItems(this,inFilename,pPVar7,pkg._7_1_);
            if (pPVar7 != (Package *)0x0) {
              icu_63::Package::~Package(pPVar7);
              operator_delete(pPVar7);
            }
          }
          if (options[0xc].doesOccur != '\0') {
            if (options[0xd].doesOccur == '\0') {
              for (out._4_4_ = 0; iVar5 = icu_63::Package::getItemCount(this), __stream = _stdout,
                  out._4_4_ < iVar5; out._4_4_ = out._4_4_ + 1) {
                pIVar9 = icu_63::Package::getItem(this,out._4_4_);
                fprintf(__stream,"%s\n",pIVar9->name);
              }
            }
            else {
              fileStream = T_FileStream_open(options[0xd].value,"w");
              if (fileStream == (FileStream *)0x0) {
                return 1;
              }
              for (out._4_4_ = 0; iVar5 = icu_63::Package::getItemCount(this), out._4_4_ < iVar5;
                  out._4_4_ = out._4_4_ + 1) {
                pIVar9 = icu_63::Package::getItem(this,out._4_4_);
                T_FileStream_writeLine(fileStream,pIVar9->name);
                T_FileStream_writeLine(fileStream,"\n");
              }
              T_FileStream_close(fileStream);
            }
          }
          UVar2 = icu_63::Package::checkDependencies(this);
          if (UVar2 == '\0') {
            argv_local._4_4_ = 2;
          }
          else {
            if (pkg._5_1_) {
              if ((outComment == (char *)0x0) || (*outComment == '\0')) {
                if ((outFilename == (char *)0x0) || (*outFilename == '\0')) {
                  fprintf(_stderr,
                          "icupkg: unable to auto-generate an output filename if there is no input filename\n"
                         );
                  exit(1);
                }
                s._2_4_ = 0x61642e3f;
                s._6_2_ = 0x74;
                cVar1 = icu_63::Package::getInType(this);
                s._2_4_ = CONCAT31(s._3_3_,cVar1);
                strcpy(local_498,outFilename);
                pcVar6 = strchr(local_498,0);
                if ((5 < (long)pcVar6 - (long)local_498) &&
                   (iVar3 = memcmp(pcVar6 + -5,(void *)((long)&s + 2),5), iVar3 == 0)) {
                  pcVar6[-5] = pkg._7_1_;
                }
                outComment = local_498;
              }
              if (options[0x10].doesOccur != '\0') {
                icu_63::Package::setPrefix(this,options[0x10].value);
              }
              pkg._0_4_ = writePackageDatFile(outComment,_result,(char *)0x0,(char *)0x0,this,
                                              pkg._7_1_);
            }
            if (local_68 != (Package *)0x0) {
              icu_63::Package::~Package(local_68);
              operator_delete(local_68);
            }
            if (this != (Package *)0x0) {
              icu_63::Package::~Package(this);
              operator_delete(this);
            }
            argv_local._4_4_ = (int)pkg;
          }
        }
        else if (((((options[4].doesOccur == '\0') && (options[3].doesOccur == '\0')) &&
                  (options[8].doesOccur == '\0')) &&
                 ((options[10].doesOccur == '\0' && (options[9].doesOccur == '\0')))) &&
                ((options[0xb].doesOccur == '\0' && (options[0xc].doesOccur == '\0')))) {
          if (pkg._5_1_) {
            icu_63::Package::extractItem(this,inFilename,outComment,0,pkg._7_1_);
          }
          if (this != (Package *)0x0) {
            icu_63::Package::~Package(this);
            operator_delete(this);
          }
          argv_local._4_4_ = 0;
        }
        else {
          printUsage(pcVar6,'\0');
          argv_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    printUsage(pcVar6,'\x01');
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

extern int
main(int argc, char *argv[]) {
    const char *pname, *sourcePath, *destPath, *inFilename, *outFilename, *outComment;
    char outType;
    UBool isHelp, isModified, isPackage;
    int result = 0;

    Package *pkg, *listPkg, *addListPkg;

    U_MAIN_INIT_ARGS(argc, argv);

    /* get the program basename */
    pname=findBasename(argv[0]);

    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);
    isHelp=options[OPT_HELP_H].doesOccur || options[OPT_HELP_QUESTION_MARK].doesOccur;
    if(isHelp) {
        printUsage(pname, TRUE);
        return U_ZERO_ERROR;
    }

    pkg=new Package;
    if(pkg==NULL) {
        fprintf(stderr, "icupkg: not enough memory\n");
        return U_MEMORY_ALLOCATION_ERROR;
    }
    isModified=FALSE;

    int autoPrefix=0;
    if(options[OPT_AUTO_TOC_PREFIX].doesOccur) {
        pkg->setAutoPrefix();
        ++autoPrefix;
    }
    if(options[OPT_AUTO_TOC_PREFIX_WITH_TYPE].doesOccur) {
        if(options[OPT_TOC_PREFIX].doesOccur) {
            fprintf(stderr, "icupkg: --auto_toc_prefix_with_type and also --toc_prefix\n");
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        pkg->setAutoPrefixWithType();
        ++autoPrefix;
    }
    if(argc<2 || 3<argc || autoPrefix>1) {
        printUsage(pname, FALSE);
        return U_ILLEGAL_ARGUMENT_ERROR;
    }

    if(options[OPT_SOURCEDIR].doesOccur) {
        sourcePath=options[OPT_SOURCEDIR].value;
    } else {
        // work relative to the current working directory
        sourcePath=NULL;
    }
    if(options[OPT_DESTDIR].doesOccur) {
        destPath=options[OPT_DESTDIR].value;
    } else {
        // work relative to the current working directory
        destPath=NULL;
    }

    if(0==strcmp(argv[1], "new")) {
        if(autoPrefix) {
            fprintf(stderr, "icupkg: --auto_toc_prefix[_with_type] but no input package\n");
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        inFilename=NULL;
        isPackage=TRUE;
    } else {
        inFilename=argv[1];
        if(isPackageName(inFilename)) {
            pkg->readPackage(inFilename);
            isPackage=TRUE;
        } else {
            /* swap a single file (icuswap replacement) rather than work on a package */
            pkg->addFile(sourcePath, inFilename);
            isPackage=FALSE;
        }
    }

    if(argc>=3) {
        outFilename=argv[2];
        if(0!=strcmp(argv[1], argv[2])) {
            isModified=TRUE;
        }
    } else if(isPackage) {
        outFilename=NULL;
    } else /* !isPackage */ {
        outFilename=inFilename;
        isModified=(UBool)(sourcePath!=destPath);
    }

    /* parse the output type option */
    if(options[OPT_OUT_TYPE].doesOccur) {
        const char *type=options[OPT_OUT_TYPE].value;
        if(type[0]==0 || type[1]!=0) {
            /* the type must be exactly one letter */
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        outType=type[0];
        switch(outType) {
        case 'l':
        case 'b':
        case 'e':
            break;
        default:
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }

        /*
         * Set the isModified flag if the output type differs from the
         * input package type.
         * If we swap a single file, just assume that we are modifying it.
         * The Package class does not give us access to the item and its type.
         */
        isModified|=(UBool)(!isPackage || outType!=pkg->getInType());
    } else if(isPackage) {
        outType=pkg->getInType(); // default to input type
    } else /* !isPackage: swap single file */ {
        outType=0; /* tells extractItem() to not swap */
    }

    if(options[OPT_WRITEPKG].doesOccur) {
        isModified=TRUE;
    }

    if(!isPackage) {
        /*
         * icuswap tool replacement: Only swap a single file.
         * Check that irrelevant options are not set.
         */
        if( options[OPT_COMMENT].doesOccur ||
            options[OPT_COPYRIGHT].doesOccur ||
            options[OPT_MATCHMODE].doesOccur ||
            options[OPT_REMOVE_LIST].doesOccur ||
            options[OPT_ADD_LIST].doesOccur ||
            options[OPT_EXTRACT_LIST].doesOccur ||
            options[OPT_LIST_ITEMS].doesOccur
        ) {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        if(isModified) {
            pkg->extractItem(destPath, outFilename, 0, outType);
        }

        delete pkg;
        return result;
    }

    /* Work with a package. */

    if(options[OPT_COMMENT].doesOccur) {
        outComment=options[OPT_COMMENT].value;
    } else if(options[OPT_COPYRIGHT].doesOccur) {
        outComment=U_COPYRIGHT_STRING;
    } else {
        outComment=NULL;
    }

    if(options[OPT_MATCHMODE].doesOccur) {
        if(0==strcmp(options[OPT_MATCHMODE].value, "noslash")) {
            pkg->setMatchMode(Package::MATCH_NOSLASH);
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* remove items */
    if(options[OPT_REMOVE_LIST].doesOccur) {
        listPkg=new Package();
        if(listPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(NULL, options[OPT_REMOVE_LIST].value, FALSE, listPkg)) {
            pkg->removeItems(*listPkg);
            delete listPkg;
            isModified=TRUE;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /*
     * add items
     * use a separate Package so that its memory and items stay around
     * as long as the main Package
     */
    addListPkg=NULL;
    if(options[OPT_ADD_LIST].doesOccur) {
        addListPkg=new Package();
        if(addListPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(sourcePath, options[OPT_ADD_LIST].value, TRUE, addListPkg)) {
            pkg->addItems(*addListPkg);
            // delete addListPkg; deferred until after writePackage()
            isModified=TRUE;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* extract items */
    if(options[OPT_EXTRACT_LIST].doesOccur) {
        listPkg=new Package();
        if(listPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(NULL, options[OPT_EXTRACT_LIST].value, FALSE, listPkg)) {
            pkg->extractItems(destPath, *listPkg, outType);
            delete listPkg;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* list items */
    if(options[OPT_LIST_ITEMS].doesOccur) {
        int32_t i;
        if (options[OPT_LIST_FILE].doesOccur) {
            FileStream *out;
            out = T_FileStream_open(options[OPT_LIST_FILE].value, "w");
            if (out != NULL) {
                for(i=0; i<pkg->getItemCount(); ++i) {
                    T_FileStream_writeLine(out, pkg->getItem(i)->name);
                    T_FileStream_writeLine(out, "\n");
                }
                T_FileStream_close(out);
            } else {
                return U_ILLEGAL_ARGUMENT_ERROR;
            }
        } else {
            for(i=0; i<pkg->getItemCount(); ++i) {
                fprintf(stdout, "%s\n", pkg->getItem(i)->name);
            }
        }
    }

    /* check dependencies between items */
    if(!pkg->checkDependencies()) {
        /* some dependencies are not fulfilled */
        return U_MISSING_RESOURCE_ERROR;
    }

    /* write the output .dat package if there are any modifications */
    if(isModified) {
        char outFilenameBuffer[1024]; // for auto-generated output filename, if necessary

        if(outFilename==NULL || outFilename[0]==0) {
            if(inFilename==NULL || inFilename[0]==0) {
                fprintf(stderr, "icupkg: unable to auto-generate an output filename if there is no input filename\n");
                exit(U_ILLEGAL_ARGUMENT_ERROR);
            }

            /*
             * auto-generate a filename:
             * copy the inFilename,
             * and if the last basename character matches the input file's type,
             * then replace it with the output file's type
             */
            char suffix[6]="?.dat";
            char *s;

            suffix[0]=pkg->getInType();
            strcpy(outFilenameBuffer, inFilename);
            s=strchr(outFilenameBuffer, 0);
            if((s-outFilenameBuffer)>5 && 0==memcmp(s-5, suffix, 5)) {
                *(s-5)=outType;
            }
            outFilename=outFilenameBuffer;
        }
        if(options[OPT_TOC_PREFIX].doesOccur) {
            pkg->setPrefix(options[OPT_TOC_PREFIX].value);
        }
        result = writePackageDatFile(outFilename, outComment, NULL, NULL, pkg, outType);
    }

    delete addListPkg;
    delete pkg;
    return result;
}